

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  Status stat;
  pointer pnVar1;
  SPxOut *pSVar2;
  ostream *poVar3;
  undefined8 uVar4;
  char cVar5;
  int iVar6;
  long_long_type lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  char *pcVar13;
  uint *puVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  long lVar16;
  DIdxSet *this_01;
  byte bVar17;
  Verbosity old_verbosity_1;
  cpp_dec_float<200U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_250;
  Verbosity local_244;
  DIdxSet *local_240;
  cpp_dec_float<200U,_int,_void> local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar17 = 0;
  leavetol(&local_1b8,this);
  this->m_pricingViolCoUpToDate = true;
  this_00 = &this->m_pricingViolCo;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&this_00->m_backend,0);
  (this->infeasibilitiesCo).super_IdxSet.num = 0;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_238,(long)(this->thevectors->set).thenum,(type *)0x0);
  if (&local_138 != &(this->sparsePricingFactor).m_backend) {
    pnVar12 = &this->sparsePricingFactor;
    pcVar11 = &local_138;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pcVar11->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + (ulong)bVar17 * -8 + 4);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar17 * -8 + 4);
    }
    local_138.exp = (this->sparsePricingFactor).m_backend.exp;
    local_138.neg = (this->sparsePricingFactor).m_backend.neg;
    local_138.fpclass = (this->sparsePricingFactor).m_backend.fpclass;
    local_138.prec_elem = (this->sparsePricingFactor).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_138,&local_238)
  ;
  lVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_signed_long_long
                    (&local_138);
  lVar8 = -0x80000000;
  if (-0x80000000 < lVar7) {
    lVar8 = lVar7;
  }
  if (0x7ffffffe < lVar8) {
    lVar8 = 0x7fffffff;
  }
  if (0 < (this->thevectors->set).thenum) {
    this_01 = &this->infeasibilitiesCo;
    lVar16 = 0;
    lVar10 = 0;
    do {
      stat = ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.stat)->data[lVar10];
      if (this->theRep * stat < 1) {
        test((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_238,this,(int)lVar10,stat);
        pnVar1 = (this->theTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar11 = &local_238;
        puVar14 = (uint *)((long)(pnVar1->m_backend).data._M_elems + lVar16);
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar14 = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar17 * -8 + 4);
          puVar14 = puVar14 + (ulong)bVar17 * -2 + 1;
        }
        *(int *)((long)(&(pnVar1->m_backend).data + 1) + lVar16) = local_238.exp;
        *(bool *)((long)(&(pnVar1->m_backend).data + 1) + lVar16 + 4U) = local_238.neg;
        *(undefined8 *)((long)(&(pnVar1->m_backend).data + 1) + lVar16 + 8U) = local_238._120_8_;
        pnVar1 = (this->theTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)(pnVar1->m_backend).data._M_elems + lVar16);
        if (this->remainingRoundsEnterCo == 0) {
          pnVar12 = &local_1b8;
          pcVar15 = &local_238;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar15->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
          }
          local_238.exp = local_1b8.m_backend.exp;
          local_238.neg = local_1b8.m_backend.neg;
          local_238.fpclass = local_1b8.m_backend.fpclass;
          local_238.prec_elem = local_1b8.m_backend.prec_elem;
          if (local_238.data._M_elems[0] != ERROR ||
              local_1b8.m_backend.fpclass != cpp_dec_float_finite) {
            local_238.neg = (bool)(local_1b8.m_backend.neg ^ 1);
          }
          if (((local_1b8.m_backend.fpclass == cpp_dec_float_NaN) ||
              (*(int *)((long)(&(pnVar1->m_backend).data + 1) + lVar16 + 8U) == 2)) ||
             (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar11,&local_238), -1 < iVar6)) {
            (this->isInfeasibleCo).data[lVar10] = 0;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       (cpp_dec_float<200U,_int,_void> *)
                       ((long)(((this->theTest).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar16));
            DIdxSet::addIdx(this_01,(int)lVar10);
            (this->isInfeasibleCo).data[lVar10] = 1;
            this->m_numViol = this->m_numViol + 1;
          }
          if ((int)lVar8 < (this->infeasibilitiesCo).super_IdxSet.num) {
            pSVar2 = this->spxout;
            if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
              local_138.data._M_elems[0] = 4;
              local_238.data._M_elems[0] = pSVar2->m_verbosity;
              (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_138);
              pSVar2 = this->spxout;
              local_240 = this_01;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar2->m_streams[pSVar2->m_verbosity]," --- using dense pricing",0x18);
              cVar5 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18) +
                              cVar5);
              this_01 = local_240;
              std::ostream::put(cVar5);
              std::ostream::flush();
              (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_238);
            }
            this->remainingRoundsEnterCo = 5;
            this->sparsePricingEnterCo = false;
            (this->infeasibilitiesCo).super_IdxSet.num = 0;
          }
        }
        else {
          pnVar12 = &local_1b8;
          pcVar15 = &local_238;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar15->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
          }
          local_238.exp = local_1b8.m_backend.exp;
          local_238.neg = local_1b8.m_backend.neg;
          local_238.fpclass = local_1b8.m_backend.fpclass;
          local_238.prec_elem = local_1b8.m_backend.prec_elem;
          if (local_238.data._M_elems[0] != ERROR ||
              local_1b8.m_backend.fpclass != cpp_dec_float_finite) {
            local_238.neg = (bool)(local_1b8.m_backend.neg ^ 1);
          }
          if (((local_1b8.m_backend.fpclass != cpp_dec_float_NaN) &&
              (*(int *)((long)(&(pnVar1->m_backend).data + 1) + lVar16 + 8U) != 2)) &&
             (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar11,&local_238), iVar6 < 0)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       (cpp_dec_float<200U,_int,_void> *)
                       ((long)(((this->theTest).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar16));
            this->m_numViol = this->m_numViol + 1;
          }
        }
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)
                   ((long)(((this->theTest).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar16),0.0);
        if (this->remainingRoundsEnterCo == 0) {
          (this->isInfeasibleCo).data[lVar10] = 0;
        }
      }
      lVar10 = lVar10 + 1;
      lVar16 = lVar16 + 0x80;
    } while (lVar10 < (this->thevectors->set).thenum);
  }
  iVar6 = (this->infeasibilitiesCo).super_IdxSet.num;
  if ((iVar6 == 0) && (this->sparsePricingEnterCo == false)) {
    this->remainingRoundsEnterCo = this->remainingRoundsEnterCo + -1;
  }
  else if ((iVar6 <= (int)lVar8) && (this->sparsePricingEnterCo == false)) {
    pSVar2 = this->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (local_244 = pSVar2->m_verbosity, 3 < (int)local_244)) {
      local_238.data._M_elems[0] = 4;
      (*pSVar2->_vptr_SPxOut[2])();
      poVar3 = this->spxout->m_streams[this->spxout->m_verbosity];
      uVar4 = *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8);
      if (this->hyperPricingEnter == true) {
        pcVar13 = " --- using hypersparse pricing, ";
        lVar8 = 0x20;
      }
      else {
        pcVar13 = " --- using sparse pricing, ";
        lVar8 = 0x1b;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar13,lVar8);
      pSVar2 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity],"sparsity: ",10);
      poVar3 = pSVar2->m_streams[pSVar2->m_verbosity];
      lVar8 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x10) = 6;
      *(uint *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar3 + *(long *)(lVar8 + -0x18) + 8) = 4;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_138,(long)(this->infeasibilitiesCo).super_IdxSet.num,(type *)0x0);
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 0x1c;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems[6] = 0;
      local_b8.data._M_elems[7] = 0;
      local_b8.data._M_elems[8] = 0;
      local_b8.data._M_elems[9] = 0;
      local_b8.data._M_elems[10] = 0;
      local_b8.data._M_elems[0xb] = 0;
      local_b8.data._M_elems[0xc] = 0;
      local_b8.data._M_elems[0xd] = 0;
      local_b8.data._M_elems[0xe] = 0;
      local_b8.data._M_elems[0xf] = 0;
      local_b8.data._M_elems[0x10] = 0;
      local_b8.data._M_elems[0x11] = 0;
      local_b8.data._M_elems[0x12] = 0;
      local_b8.data._M_elems[0x13] = 0;
      local_b8.data._M_elems[0x14] = 0;
      local_b8.data._M_elems[0x15] = 0;
      local_b8.data._M_elems[0x16] = 0;
      local_b8.data._M_elems[0x17] = 0;
      local_b8.data._M_elems[0x18] = 0;
      local_b8.data._M_elems[0x19] = 0;
      local_b8.data._M_elems._104_5_ = 0;
      local_b8.data._M_elems[0x1b]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_238,(long)(this->thevectors->set).thenum,(type *)0x0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_b8,&local_138,&local_238);
      boost::multiprecision::operator<<
                (pSVar2->m_streams[pSVar2->m_verbosity],
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_b8);
      poVar3 = pSVar2->m_streams[pSVar2->m_verbosity];
      lVar8 = *(long *)poVar3;
      *(uint *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar8 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      local_250 = (int)uVar4;
      *(long *)(poVar3 + *(long *)(lVar8 + -0x18) + 8) = (long)local_250;
      std::ios::widen((char)*(undefined8 *)(lVar8 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_244);
    }
    this->sparsePricingEnterCo = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeTest()
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();
   m_pricingViolCoUpToDate = true;
   m_pricingViolCo = 0;

   infeasibilitiesCo.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * coDim());

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(isBasic(stat))
      {
         theTest[i] = 0.0;

         if(remainingRoundsEnterCo == 0)
            isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         assert(!isBasic(stat));
         theTest[i] = test(i, stat);

         if(remainingRoundsEnterCo == 0)
         {
            if(theTest[i] < -pricingTol)
            {
               assert(infeasibilitiesCo.size() < infeasibilitiesCo.max());
               m_pricingViolCo -= theTest[i];
               infeasibilitiesCo.addIdx(i);
               isInfeasibleCo[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilitiesCo.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnterCo = SOPLEX_DENSEROUNDS;
               sparsePricingEnterCo = false;
               infeasibilitiesCo.clear();
            }
         }
         else if(theTest[i] < -pricingTol)
         {
            m_pricingViolCo -= theTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilitiesCo.size() == 0 && !sparsePricingEnterCo)
      --remainingRoundsEnterCo;
   else if(infeasibilitiesCo.size() <= sparsitythreshold && !sparsePricingEnterCo)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilitiesCo.size() / coDim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnterCo = true;
   }
}